

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O3

lgx_co_t * lgx_co_create(lgx_vm_t *vm,lgx_function_t *fun)

{
  uint uVar1;
  lgx_co_s *plVar2;
  lgx_list_s *plVar3;
  lgx_co_t *__ptr;
  lgx_value_t *plVar4;
  unsigned_long_long uVar5;
  size_t __nmemb;
  
  uVar1 = vm->co_count;
  if (((uVar1 < 0x100001) && (fun->buildin == (_func_int_lgx_vm_s_ptr *)0x0)) &&
     (__ptr = (lgx_co_t *)calloc(1,0x68), __ptr != (lgx_co_t *)0x0)) {
    __nmemb = 0x10;
    if (0x10 < fun->stack_size) {
      __nmemb = (size_t)fun->stack_size;
    }
    (__ptr->stack).size = (uint)__nmemb;
    plVar4 = (lgx_value_t *)calloc(__nmemb,0x10);
    (__ptr->stack).buf = plVar4;
    if (plVar4 != (lgx_value_t *)0x0) {
      plVar2 = vm->co_running;
      if (plVar2 != (lgx_co_s *)0x0) {
        plVar2->ref_cnt = plVar2->ref_cnt + 1;
        __ptr->parent = plVar2;
      }
      __ptr->pc = fun->addr;
      __ptr->vm = vm;
      plVar3 = (vm->co_ready).prev;
      (vm->co_ready).prev = (lgx_list_s *)__ptr;
      (__ptr->head).next = &vm->co_ready;
      (__ptr->head).prev = plVar3;
      plVar3->next = (lgx_list_s *)__ptr;
      plVar4->type = T_FUNCTION;
      (plVar4->v).fun = fun;
      plVar4[1].type = T_LONG;
      plVar4[1].v.l = 1;
      plVar4[2].type = T_LONG;
      plVar4[2].v.l = -1;
      plVar4[3].type = T_LONG;
      plVar4[3].v.l = -1;
      uVar5 = vm->co_id + 1;
      vm->co_id = uVar5;
      __ptr->id = uVar5;
      vm->co_count = uVar1 + 1;
      return __ptr;
    }
    free(__ptr);
  }
  return (lgx_co_t *)0x0;
}

Assistant:

lgx_co_t* lgx_co_create(lgx_vm_t *vm, lgx_function_t *fun) {
    if (vm->co_count > LGX_MAX_CO_LIMIT) {
        return NULL;
    }

    if (fun->buildin) {
        // 只支持为 xscript 函数创建协程
        return NULL;
    }

    lgx_co_t *co = (lgx_co_t *)xcalloc(1, sizeof(lgx_co_t));
    if (!co) {
        return NULL;
    }

    if (lgx_co_stack_init(&co->stack, fun->stack_size > 16 ? fun->stack_size : 16)) {
        xfree(co);
        return NULL;
    }

    if (vm->co_running) {
        vm->co_running->ref_cnt ++;
        co->parent = vm->co_running;
    }
    co->pc = fun->addr;
    co->on_yield = NULL;

    co->vm = vm;

    co->status = CO_READY;
    lgx_list_add_tail(&co->head, &vm->co_ready);

    // 初始化函数
    lgx_co_set_function(co, 0, fun);
    // 写入返回值地址
    lgx_co_set_long(co, 1, 1);
    // 写入返回地址
    lgx_co_set_long(co, 2, -1);
    // 写入堆栈地址
    lgx_co_set_long(co, 3, -1);

    co->id = ++vm->co_id;
    vm->co_count ++;

    return co;
}